

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       map_caster<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>,std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
       ::
       cast<std::map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>const&>
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  _Rb_tree_node_base *p_Var1;
  handle hVar2;
  handle local_70 [2];
  handle local_60;
  handle local_58;
  handle local_50;
  handle local_48;
  object key;
  object value;
  dict d;
  
  dict::dict((dict *)&value);
  p_Var1 = (src->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  hVar2 = value.super_handle.m_ptr;
  do {
    if ((_Rb_tree_header *)p_Var1 == &(src->_M_t)._M_impl.super__Rb_tree_header) {
      value.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_002be332:
      object::~object(&value);
      return (handle)hVar2.m_ptr;
    }
    value.super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
    local_48 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ::cast((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var1 + 1),policy,parent);
    key.super_handle =
         tuple_caster<std::tuple,unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>
         ::
         cast_impl<std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>const&,0ul,1ul,2ul,3ul,4ul>
                   (p_Var1 + 2,policy,parent.m_ptr);
    if ((local_48.m_ptr == (PyObject *)0x0) || (key.super_handle.m_ptr == (PyObject *)0x0)) {
      object::~object(&key);
      object::~object((object *)&local_48);
      hVar2.m_ptr = (PyObject *)0x0;
      goto LAB_002be332;
    }
    (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + 1;
    local_60 = value.super_handle.m_ptr;
    local_58.m_ptr = local_48.m_ptr;
    local_70[0].m_ptr = (PyObject *)0x0;
    local_50.m_ptr = (PyObject *)0x0;
    object::~object((object *)local_70);
    accessor_policies::generic_item::set(local_60,local_58,key.super_handle.m_ptr);
    object::~object((object *)&local_50);
    object::~object((object *)&local_58);
    object::~object(&key);
    object::~object((object *)&local_48);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    hVar2 = value.super_handle.m_ptr;
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }